

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_log.cpp
# Opt level: O2

int miniros::file_log::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  const_iterator cVar4;
  string *psVar5;
  size_t i;
  ulong uVar6;
  allocator<char> local_17b;
  allocator<char> local_17a;
  allocator<char> local_179;
  path log_file_name_1;
  path local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string log_file_name;
  string ros_log_env;
  char pid_str [100];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  log_file_name._M_dataplus._M_p = (pointer)&log_file_name.field_2;
  log_file_name._M_string_length = 0;
  log_file_name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pid_str,"__log",(allocator<char> *)&log_file_name_1);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)ctx,(key_type *)pid_str);
  std::__cxx11::string::~string((string *)pid_str);
  if (cVar4._M_node != (_Base_ptr)(ctx + 8)) {
    std::__cxx11::string::_M_assign((string *)&log_file_name);
  }
  if (log_file_name._M_string_length != 0) goto LAB_00219b75;
  uVar2 = getpid();
  ros_log_env._M_dataplus._M_p = (pointer)&ros_log_env.field_2;
  ros_log_env._M_string_length = 0;
  ros_log_env.field_2._M_local_buf[0] = '\0';
  bVar1 = get_environment_variable(&ros_log_env,"ROS_LOG_DIR");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_file_name_1,"/",(allocator<char> *)&local_150);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pid_str,
                   &ros_log_env,&log_file_name_1._M_pathname);
LAB_00219a15:
    std::__cxx11::string::operator=((string *)&log_file_name,(string *)pid_str);
    std::__cxx11::string::~string((string *)pid_str);
    std::__cxx11::string::~string((string *)&log_file_name_1);
  }
  else {
    bVar1 = get_environment_variable(&ros_log_env,"ROS_HOME");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_file_name_1,"/log/",(allocator<char> *)&local_150);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pid_str,
                     &ros_log_env,&log_file_name_1._M_pathname);
      goto LAB_00219a15;
    }
    bVar1 = get_environment_variable(&ros_log_env,"HOME");
    if (bVar1) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&log_file_name_1,&ros_log_env,auto_format);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,".ros",(allocator<char> *)&local_58);
      std::filesystem::__cxx11::path::path(&local_150,&local_128,auto_format);
      std::filesystem::__cxx11::operator/((path *)pid_str,&log_file_name_1,&local_150);
      std::filesystem::__cxx11::path::~path(&local_150);
      std::__cxx11::string::~string((string *)&local_128);
      std::filesystem::__cxx11::path::~path(&log_file_name_1);
      std::filesystem::create_directory((path *)pid_str);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"log",(allocator<char> *)&local_58);
      std::filesystem::__cxx11::path::path(&local_150,&local_128,auto_format);
      std::filesystem::__cxx11::operator/(&log_file_name_1,(path *)pid_str,&local_150);
      std::filesystem::__cxx11::path::~path(&local_150);
      std::__cxx11::string::~string((string *)&local_128);
      std::filesystem::create_directory(&log_file_name_1);
      std::filesystem::__cxx11::path::~path(&log_file_name_1);
      std::filesystem::__cxx11::path::~path((path *)pid_str);
    }
  }
  for (uVar6 = 1; psVar5 = this_node::getName_abi_cxx11_(), uVar6 < psVar5->_M_string_length;
      uVar6 = uVar6 + 1) {
    psVar5 = this_node::getName_abi_cxx11_();
    iVar3 = isalnum((int)(psVar5->_M_dataplus)._M_p[uVar6]);
    if (iVar3 != 0) {
      this_node::getName_abi_cxx11_();
    }
    std::__cxx11::string::push_back((char)&log_file_name);
  }
  snprintf(pid_str,100,"%d",(ulong)uVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"_",&local_179);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pid_str,&local_17a);
  std::operator+(&local_150._M_pathname,&local_128,&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,".log",&local_17b);
  std::operator+(&log_file_name_1._M_pathname,&local_150._M_pathname,&local_38);
  std::__cxx11::string::append((string *)&log_file_name);
  std::__cxx11::string::~string((string *)&log_file_name_1);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&ros_log_env);
LAB_00219b75:
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&log_file_name_1,&log_file_name,auto_format);
  std::filesystem::absolute((path *)pid_str);
  std::filesystem::__cxx11::path::string(&local_150._M_pathname,(path *)pid_str);
  std::__cxx11::string::operator=((string *)&log_file_name,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::filesystem::__cxx11::path::~path((path *)pid_str);
  std::filesystem::__cxx11::path::~path(&log_file_name_1);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&log_file_name_1,&log_file_name,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::string(&local_150._M_pathname,(path *)pid_str);
  std::__cxx11::string::operator=((string *)&g_log_directory_abi_cxx11_,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::filesystem::__cxx11::path::~path((path *)pid_str);
  std::filesystem::__cxx11::path::~path(&log_file_name_1);
  iVar3 = std::__cxx11::string::~string((string *)&log_file_name);
  return iVar3;
}

Assistant:

void init(const M_string& remappings)
{
  std::string log_file_name;
  M_string::const_iterator it = remappings.find("__log");
  if (it != remappings.end())
  {
    log_file_name = it->second;
  }

  {
    // Log filename can be specified on the command line through __log
    // If it's been set, don't create our own name
    if (log_file_name.empty())
    {
      // Setup the logfile appender
      // Can't do this in rosconsole because the node name is not known
      pid_t pid = getpid();
      std::string ros_log_env;
      if ( get_environment_variable(ros_log_env, "ROS_LOG_DIR"))
      {
        log_file_name = ros_log_env + std::string("/");
      }
      else
      {
        if ( get_environment_variable(ros_log_env, "ROS_HOME"))
        {
          log_file_name = ros_log_env + std::string("/log/");
        }
        else
        {
          // Not cross-platform?
          if( get_environment_variable(ros_log_env, "HOME") )
          {
            fs::path dotros = fs::path(ros_log_env) / std::string(".ros");
            fs::create_directory(dotros);
            fs::path log_file_name = dotros / std::string("log");
            fs::create_directory(log_file_name);
          }
        }
      }

      // sanitize the node name and tack it to the filename
      for (size_t i = 1; i < this_node::getName().length(); i++)
      {
        if (!isalnum(this_node::getName()[i]))
        {
          log_file_name += '_';
        }
        else
        {
          log_file_name += this_node::getName()[i];
        }
      }

      char pid_str[100];
      std::snprintf(pid_str, sizeof(pid_str), "%d", pid);
      log_file_name += std::string("_") + std::string(pid_str) + std::string(".log");
    }

    log_file_name = fs::absolute(log_file_name).string();
    g_log_directory = fs::path(log_file_name).parent_path().string();
  }
}